

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OstreamSupport.cpp
# Opt level: O0

ostream * operator<<(ostream *out,List<MiniScript::String> *rhs)

{
  long lVar1;
  String *rhs_00;
  int local_1c;
  int i;
  List<MiniScript::String> *rhs_local;
  ostream *out_local;
  
  std::operator<<(out,'[');
  local_1c = 0;
  while( true ) {
    lVar1 = MiniScript::List<MiniScript::String>::Count(rhs);
    if (lVar1 <= local_1c) break;
    if (0 < local_1c) {
      std::operator<<(out,", ");
    }
    rhs_00 = MiniScript::List<MiniScript::String>::operator[](rhs,(long)local_1c);
    operator<<(out,rhs_00);
    local_1c = local_1c + 1;
  }
  std::operator<<(out,']');
  return out;
}

Assistant:

ostream & operator<< (ostream &out, const List<String> &rhs) {
	out << '[';
	for (int i=0; i<rhs.Count(); i++) {
		if (i > 0) out << ", ";
		out << rhs[i];
	}
	out << ']';
	return out;
}